

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O3

void init_tree(log_multi *d)

{
  node node;
  node local_78;
  
  local_78.parent = 0;
  local_78.preds._begin = (node_pred *)0x0;
  local_78.preds._end = (node_pred *)0x0;
  local_78.preds.end_array = (node_pred *)0x0;
  local_78.preds.erase_count._0_5_ = 0;
  local_78.preds.erase_count._5_3_ = 0;
  local_78.min_count = 0;
  local_78.internal = false;
  v_array<node_pred>::clear(&local_78.preds);
  local_78.base_predictor = 0;
  local_78.left = 0;
  local_78._60_8_ = 0;
  local_78._68_8_ = 0;
  local_78.max_count = 0;
  local_78.max_count_label = 1;
  local_78.right = 0;
  v_array<node>::push_back(&d->nodes,&local_78);
  d->nbofswaps = 0;
  return;
}

Assistant:

void init_tree(log_multi& d)
{
  d.nodes.push_back(init_node());
  d.nbofswaps = 0;
}